

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

bool WriteAppleDODisk(FILE *f_,Disk *disk,Format *fmt)

{
  Format *args_1;
  int *args_2;
  int *args_3;
  int local_88 [4];
  anon_class_32_4_aae98526 local_78;
  function<void_(const_CylHead_&)> local_58;
  Range local_34;
  int local_24;
  Format *pFStack_20;
  int missing;
  Format *fmt_local;
  Disk *disk_local;
  FILE *f__local;
  
  local_24 = 0;
  pFStack_20 = fmt;
  fmt_local = (Format *)disk;
  disk_local = (Disk *)f_;
  local_34 = Format::range(fmt);
  local_78.disk = (Disk *)fmt_local;
  local_78.fmt = pFStack_20;
  local_78.missing = &local_24;
  local_78.f_ = (FILE **)&disk_local;
  std::function<void(CylHead_const&)>::
  function<WriteAppleDODisk(_IO_FILE*,Disk&,Format_const&)::__0,void>
            ((function<void(CylHead_const&)> *)&local_58,&local_78);
  Range::each(&local_34,&local_58,(bool)(pFStack_20->cyls_first & 1));
  std::function<void_(const_CylHead_&)>::~function(&local_58);
  args_1 = pFStack_20;
  if ((local_24 != 0) && (opt.minimal == 0)) {
    args_2 = &pFStack_20->heads;
    args_3 = &pFStack_20->sectors;
    local_88[0] = Format::sector_size(pFStack_20);
    Message<int&,int_const&,int_const&,int_const&,int>
              (msgWarning,"source missing %u sectors from %u/%u/%u/%u regular format",&local_24,
               &args_1->cyls,args_2,args_3,local_88);
  }
  return true;
}

Assistant:

bool WriteAppleDODisk(FILE* f_, Disk& disk, const Format& fmt)
{
    auto missing = 0;
    static const int map[16] = { 0, 13, 11, 9, 7, 5, 3, 1, 14, 12, 10, 8, 6, 4, 2, 15 };

    fmt.range().each([&](const CylHead& cylhead) {
        const auto& track = disk.read_track(cylhead);
        Header header(cylhead, 0, fmt.size);

        for (int sector = fmt.base; sector < fmt.base + fmt.sectors; ++sector)
        {
            Data buf(fmt.sector_size(), fmt.fill);
            header.sector = map[sector];

            auto it = track.find(header);
            if (it != track.end() && (*it).has_data())
            {
                const auto& data = (*it).data_copy();
                std::copy(data.begin(), data.begin() + std::min(data.size(), buf.size()), buf.begin());
            }
            else
            {
                missing++;
            }

            if (!fwrite(buf.data(), buf.size(), 1, f_))
                throw util::exception("write error, disk full?");
        }
        }, fmt.cyls_first);

    if (missing && !opt.minimal)
        Message(msgWarning, "source missing %u sectors from %u/%u/%u/%u regular format", missing, fmt.cyls, fmt.heads, fmt.sectors, fmt.sector_size());

    return true;
}